

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::updateFtranBFRT(HDual *this)

{
  HTimer *in_RDI;
  HFactor *unaff_retaddr;
  int in_stack_ffffffffffffffec;
  HTimer *bfrtColumn;
  
  if (*(int *)((long)in_RDI->itemTicks + 0x7c) == 0) {
    bfrtColumn = in_RDI;
    HTimer::recordStart(in_RDI,in_stack_ffffffffffffffec);
    HDualRow::update_flip((HDualRow *)unaff_retaddr,(HVector *)bfrtColumn);
    if (*(int *)&in_RDI->field_0x38c != 0) {
      HFactor::ftran(unaff_retaddr,(HVector *)bfrtColumn,(double)in_RDI);
    }
    HTimer::recordFinish(in_RDI,in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

void HDual::updateFtranBFRT() {
	if (invertHint)
		return;
	model->timer.recordStart(HTICK_FTRAN_MIX);
	dualRow.update_flip(&columnBFRT);
	if (columnBFRT.count)
		factor->ftran(columnBFRT, columnDensity);
	model->timer.recordFinish(HTICK_FTRAN_MIX);
}